

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isModifierAllowedAfter(TokenKind mod,TokenKind prev)

{
  bool local_9;
  TokenKind prev_local;
  TokenKind mod_local;
  
  if (mod != AutomaticKeyword) {
    if (mod == ConstKeyword) {
      return false;
    }
    if (mod != StaticKeyword) {
      if (mod != VarKeyword) {
        return false;
      }
      return prev == ConstKeyword;
    }
  }
  local_9 = prev == VarKeyword || prev == ConstKeyword;
  return local_9;
}

Assistant:

bool SyntaxFacts::isModifierAllowedAfter(TokenKind mod, TokenKind prev) {
    switch (mod) {
        case TokenKind::ConstKeyword: return false;
        case TokenKind::VarKeyword: return prev == TokenKind::ConstKeyword;
        case TokenKind::StaticKeyword:
        case TokenKind::AutomaticKeyword:
            return prev == TokenKind::VarKeyword || prev == TokenKind::ConstKeyword;
        default:
            return false;
    }
}